

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O2

void Ssw_CheckConstraints(Ssw_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  uint uVar4;
  uint uVar5;
  Ssw_Man_t *pSVar6;
  int i;
  
  uVar4 = p->pFrames->nObjs[3] - p->pAig->nRegs;
  if ((uVar4 & 1) == 0) {
    uVar5 = 0;
    pSVar6 = p;
    for (i = 0; i < (int)uVar4; i = i + 2) {
      pAVar2 = Aig_ManCo(p->pFrames,i);
      pAVar3 = Aig_ManCo(p->pFrames,i + 1);
      pSVar6 = p;
      iVar1 = Ssw_NodesAreEquiv(p,(Aig_Obj_t *)((ulong)pAVar2->pFanin0 & 0xfffffffffffffffe),
                                (Aig_Obj_t *)((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe));
      if (iVar1 != 1) {
        pSVar6 = p;
        Ssw_NodesAreConstrained(p,pAVar2->pFanin0,pAVar3->pFanin0);
        uVar5 = uVar5 + 1;
      }
    }
    Abc_Print((int)pSVar6,"Total constraints = %d. Added constraints = %d.\n",
              (ulong)(uint)((int)uVar4 >> 1),(ulong)uVar5);
    return;
  }
  __assert_fail("(nConstrPairs & 1) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSweep.c"
                ,0x5a,"void Ssw_CheckConstraints(Ssw_Man_t *)");
}

Assistant:

void Ssw_CheckConstraints( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObj2;
    int nConstrPairs, i;
    int Counter = 0;
    nConstrPairs = Aig_ManCoNum(p->pFrames)-Aig_ManRegNum(p->pAig);
    assert( (nConstrPairs & 1) == 0 );
    for ( i = 0; i < nConstrPairs; i += 2 )
    {
        pObj  = Aig_ManCo( p->pFrames, i   );
        pObj2 = Aig_ManCo( p->pFrames, i+1 );
        if ( Ssw_NodesAreEquiv( p, Aig_ObjFanin0(pObj), Aig_ObjFanin0(pObj2) ) != 1 )
        {
            Ssw_NodesAreConstrained( p, Aig_ObjChild0(pObj), Aig_ObjChild0(pObj2) );
            Counter++;
        }
    }
    Abc_Print( 1, "Total constraints = %d. Added constraints = %d.\n", nConstrPairs/2, Counter );
}